

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double __thiscall icu_63::CalendarAstronomer::eclipticObliquity(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  double T;
  double epoch;
  CalendarAstronomer *this_local;
  
  UVar1 = isINVALID(this->eclipObliquity);
  if (UVar1 != '\0') {
    dVar2 = getJulianDay(this);
    dVar2 = (dVar2 - 2451545.0) / 36525.0;
    this->eclipObliquity =
         dVar2 * 5.027777777777778e-07 * dVar2 * dVar2 +
         -(dVar2 * 1.6666666666666665e-07) * dVar2 + dVar2 * -0.013004166666666666 + 23.439292;
    this->eclipObliquity = this->eclipObliquity * 0.017453292519943295;
  }
  return this->eclipObliquity;
}

Assistant:

double CalendarAstronomer::eclipticObliquity() {
    if (isINVALID(eclipObliquity)) {
        const double epoch = 2451545.0;     // 2000 AD, January 1.5

        double T = (getJulianDay() - epoch) / 36525;

        eclipObliquity = 23.439292
            - 46.815/3600 * T
            - 0.0006/3600 * T*T
            + 0.00181/3600 * T*T*T;

        eclipObliquity *= DEG_RAD;
    }
    return eclipObliquity;
}